

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetCollectLinkLanguages::Visit(cmTargetCollectLinkLanguages *this,cmLinkItem *item)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  long lVar4;
  cmLocalGenerator *pcVar5;
  ostream *poVar6;
  cmake *this_00;
  cmLinkInterface *this_01;
  reference __x;
  reference item_00;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  cmLinkItem *lib;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range1_1;
  string *language;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmLinkInterface *iface;
  undefined1 local_1f8 [16];
  string local_1e8;
  string local_1c8;
  undefined1 local_198 [8];
  ostringstream e;
  MessageType local_20;
  MessageType messageType;
  bool noMessage;
  cmLinkItem *item_local;
  cmTargetCollectLinkLanguages *this_local;
  
  if (item->Target == (cmGeneratorTarget *)0x0) {
    psVar3 = cmLinkItem::AsStr_abi_cxx11_(item);
    lVar4 = std::__cxx11::string::find((char *)psVar3,0x82d069);
    if (lVar4 != -1) {
      bVar1 = false;
      local_20 = FATAL_ERROR;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->Target);
      PVar2 = cmLocalGenerator::GetPolicyStatus(pcVar5,CMP0028);
      if (PVar2 == OLD) {
        bVar1 = true;
      }
      else if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x1c,id);
        poVar6 = std::operator<<((ostream *)local_198,(string *)&local_1c8);
        std::operator<<(poVar6,"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        local_20 = AUTHOR_WARNING;
      }
      if (!bVar1) {
        poVar6 = std::operator<<((ostream *)local_198,"Target \"");
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        poVar6 = std::operator<<(poVar6,(string *)psVar3);
        poVar6 = std::operator<<(poVar6,"\" links to target \"");
        psVar3 = cmLinkItem::AsStr_abi_cxx11_(item);
        poVar6 = std::operator<<(poVar6,(string *)psVar3);
        std::operator<<(poVar6,
                        "\" but the target was not found.  Perhaps a find_package() call is missing for an IMPORTED target, or an ALIAS target is missing?"
                       );
        pcVar5 = cmGeneratorTarget::GetLocalGenerator(this->Target);
        this_00 = cmLocalGenerator::GetCMakeInstance(pcVar5);
        std::__cxx11::ostringstream::str();
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1f8);
        cmake::IssueMessage(this_00,local_20,(string *)(local_1f8 + 0x10),
                            (cmListFileBacktrace *)local_1f8);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1f8);
        std::__cxx11::string::~string((string *)(local_1f8 + 0x10));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    }
  }
  else {
    pVar7 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(&this->Visited,&item->Target);
    if ((((pVar7.second ^ 0xffU) & 1) == 0) &&
       (this_01 = cmGeneratorTarget::GetLinkInterface(item->Target,&this->Config,this->HeadTarget),
       this_01 != (cmLinkInterface *)0x0)) {
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this_01->Languages);
      language = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this_01->Languages);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&language), bVar1) {
        __x = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(this->Languages,__x);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      __end1_1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                           ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)this_01);
      lib = (cmLinkItem *)
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                 *)&lib), bVar1) {
        item_00 = __gnu_cxx::
                  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                  ::operator*(&__end1_1);
        Visit(this,item_00);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&__end1_1);
      }
    }
  }
  return;
}

Assistant:

void Visit(cmLinkItem const& item)
  {
    if (!item.Target) {
      if (item.AsStr().find("::") != std::string::npos) {
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        std::ostringstream e;
        switch (this->Target->GetLocalGenerator()->GetPolicyStatus(
          cmPolicies::CMP0028)) {
          case cmPolicies::WARN: {
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0028) << "\n";
            messageType = MessageType::AUTHOR_WARNING;
          } break;
          case cmPolicies::OLD:
            noMessage = true;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            // Issue the fatal message.
            break;
        }

        if (!noMessage) {
          e << "Target \"" << this->Target->GetName()
            << "\" links to target \"" << item.AsStr()
            << "\" but the target was not found.  Perhaps a find_package() "
               "call is missing for an IMPORTED target, or an ALIAS target is "
               "missing?";
          this->Target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
            messageType, e.str(), this->Target->GetBacktrace());
        }
      }
      return;
    }
    if (!this->Visited.insert(item.Target).second) {
      return;
    }
    cmLinkInterface const* iface =
      item.Target->GetLinkInterface(this->Config, this->HeadTarget);
    if (!iface) {
      return;
    }

    for (std::string const& language : iface->Languages) {
      this->Languages.insert(language);
    }

    for (cmLinkItem const& lib : iface->Libraries) {
      this->Visit(lib);
    }
  }